

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEdge.c
# Opt level: O2

int Edg_ManAssignEdgeNew(Gia_Man_t *p,int nEdges,int fVerbose)

{
  Vec_Int_t **p_00;
  Vec_Int_t **p_01;
  uint uVar1;
  uint DelayMax;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Vec_Wec_t *vEdges;
  Vec_Int_t *pVVar6;
  int i;
  int i_00;
  uint uVar7;
  uint local_88;
  Vec_Int_t *local_68;
  Vec_Int_t *local_60;
  Vec_Int_t *vEdge2;
  Vec_Int_t *vEdge1;
  
  vEdges = Vec_WecStart(0);
  vEdge1 = (Vec_Int_t *)0x0;
  vEdge2 = (Vec_Int_t *)0x0;
  if (fVerbose != 0) {
    printf("Running edge assignment with E = %d.\n",(ulong)(uint)nEdges);
  }
  Edg_ManToMapping(p);
  p_00 = &p->vEdge1;
  Vec_IntFreeP(p_00);
  p_01 = &p->vEdge2;
  Vec_IntFreeP(p_01);
  pVVar6 = Vec_IntStart(p->nObjs);
  p->vEdge1 = pVVar6;
  pVVar6 = Vec_IntStart(p->nObjs);
  p->vEdge2 = pVVar6;
  uVar1 = 0xffffffff;
  local_88 = 1000000000;
  local_68 = (Vec_Int_t *)0x0;
  local_60 = (Vec_Int_t *)0x0;
  uVar7 = 0;
  DelayMax = 0;
  do {
    if ((9999 < uVar7) || ((int)(uVar1 + 0x32) < (int)uVar7)) break;
    DelayMax = Edg_ManEvalEdgeDelay(p);
    iVar2 = Edg_ManEvalEdgeDelayR(p);
    if (DelayMax != iVar2 + 1U) {
      __assert_fail("DelayD == DelayR + DelayNoEdge",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEdge.c"
                    ,0x3b2,"int Edg_ManAssignEdgeNew(Gia_Man_t *, int, int)");
    }
    if ((int)DelayMax < (int)local_88) {
      Vec_IntFreeP(&vEdge1);
      local_60 = Vec_IntDup(*p_00);
      vEdge1 = local_60;
      Vec_IntFreeP(&vEdge2);
      local_68 = Vec_IntDup(*p_01);
      local_88 = DelayMax;
      vEdge2 = local_68;
      uVar1 = uVar7;
    }
    if (fVerbose != 0) {
      printf("\nIter %4d : Delay = %4d\n",(ulong)uVar7,(ulong)DelayMax);
    }
    Edg_ManCollectCritEdges(p,vEdges,DelayMax);
    iVar2 = vEdges->nSize;
    qsort(vEdges->pArray,(long)iVar2,0x10,Vec_WecSortCompare1);
    i_00 = 0;
    iVar3 = 0;
    if (0 < iVar2) {
      iVar3 = iVar2;
    }
    for (; iVar4 = iVar3, i_00 != iVar3; i_00 = i_00 + 1) {
      pVVar6 = Vec_WecEntry(vEdges,i_00);
      for (i = 0; iVar5 = pVVar6->nSize, i < iVar5; i = i + 1) {
        iVar4 = Vec_IntEntry(pVVar6,i);
        iVar4 = Edg_ObjImprove(p,iVar4,nEdges,DelayMax,fVerbose);
        if (iVar4 != 0) {
          iVar5 = pVVar6->nSize;
          break;
        }
      }
      iVar4 = i_00;
      if (i < iVar5) break;
    }
    uVar7 = uVar7 + 1;
  } while (iVar4 != iVar2);
  Vec_WecFree(vEdges);
  Vec_IntFreeP(p_00);
  *p_00 = local_60;
  Vec_IntFreeP(p_01);
  *p_01 = local_68;
  return DelayMax;
}

Assistant:

int Edg_ManAssignEdgeNew( Gia_Man_t * p, int nEdges, int fVerbose )
{
    int DelayNoEdge = 1;
    int fLevelVerbose = 0;
    Vec_Int_t * vLevel;
    Vec_Wec_t * vEdges = Vec_WecStart(0);
    Vec_Int_t * vEdge1 = NULL, * vEdge2 = NULL;
    int DelayD = 0, DelayR = 0, DelayPrev = ABC_INFINITY;
    int k, j, i, iLast = -1, iObj;
    if ( fVerbose )
        printf( "Running edge assignment with E = %d.\n", nEdges );
    // create fanouts
    Edg_ManToMapping( p );
    // create empty assignment
    Vec_IntFreeP( &p->vEdge1 );
    Vec_IntFreeP( &p->vEdge2 );
    p->vEdge1 = Vec_IntStart( Gia_ManObjNum(p) );
    p->vEdge2 = Vec_IntStart( Gia_ManObjNum(p) );
    // perform optimization
    for ( i = 0; i < 10000; i++ )
    {
        // if there is no improvement after 10 iterations, quit
        if ( i > iLast + 50 )
            break;
        // create delay information
        DelayD = Edg_ManEvalEdgeDelay( p );
        DelayR = Edg_ManEvalEdgeDelayR( p );
        assert( DelayD == DelayR + DelayNoEdge );
        if ( DelayPrev > DelayD )
        {
            //printf( "Saving backup point at %d levels.\n", DelayD );
            Vec_IntFreeP( &vEdge1 );  vEdge1 = Vec_IntDup( p->vEdge1 );
            Vec_IntFreeP( &vEdge2 );  vEdge2 = Vec_IntDup( p->vEdge2 );
            DelayPrev = DelayD;
            iLast = i;
        }
        if ( fVerbose )
            printf( "\nIter %4d : Delay = %4d\n", i, DelayD );
        // collect critical nodes (nodes with critical edges)
        Edg_ManCollectCritEdges( p, vEdges, DelayD );
        // sort levels according to the number of critical edges
        if ( fLevelVerbose )
        {
            Vec_WecForEachLevel( vEdges, vLevel, k )
                Vec_IntPush( vLevel, k );
        }
        Vec_WecSort( vEdges, 0 );
        if ( fLevelVerbose )
        {
            Vec_WecForEachLevel( vEdges, vLevel, k )
            {
                int Level = Vec_IntPop( vLevel );
                printf( "%d: Level %2d : ", k, Level );
                Vec_IntPrint( vLevel );
            }
        }
        Vec_WecForEachLevel( vEdges, vLevel, k )
        {
            Vec_IntForEachEntry( vLevel, iObj, j )
                if ( Edg_ObjImprove(p, iObj, nEdges, DelayD, fVerbose) ) // improved
                    break;
            if ( j < Vec_IntSize(vLevel) )
                break;
        }
        if ( k == Vec_WecSize(vEdges) ) // if we could not improve anything, quit
            break;
    }
    Vec_WecFree( vEdges );
    // update to the saved version
    Vec_IntFreeP( &p->vEdge1 );  p->vEdge1 = vEdge1;
    Vec_IntFreeP( &p->vEdge2 );  p->vEdge2 = vEdge2;
    return DelayD;
}